

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.h
# Opt level: O3

Type * __thiscall
mnf::Manifold::getConstView<1,2>
          (Type *__return_storage_ptr__,Manifold *this,ConstRefMat *val,size_t ir,size_t param_3)

{
  PointerType pdVar1;
  ulong uVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar5;
  undefined4 extraout_var_00;
  
  iVar3 = (*this->_vptr_Manifold[7])(this);
  if (CONCAT44(extraout_var,iVar3) <= ir) {
    __assert_fail("i < numberOfSubManifolds() && \"invalid index\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/include/manifolds/Manifold.h"
                  ,0x1bc,"Index mnf::Manifold::getStart(size_t) const");
  }
  iVar3 = (*this->_vptr_Manifold[0x10])(this,ir);
  uVar4 = CONCAT44(extraout_var_00,iVar3);
  iVar3 = (*this->_vptr_Manifold[7])(this);
  if (CONCAT44(extraout_var_01,iVar3) <= ir) {
    __assert_fail("i < numberOfSubManifolds() && \"invalid index\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/include/manifolds/Manifold.h"
                  ,0x1d6,"Index mnf::Manifold::getDim(size_t) const");
  }
  iVar3 = (*this->_vptr_Manifold[8])(this,ir);
  uVar5 = tangentDim((Manifold *)CONCAT44(extraout_var_02,iVar3));
  pdVar1 = (val->
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_data;
  uVar2 = (val->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value;
  (__return_storage_ptr__->
  super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
  ).
  super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
  .m_data = pdVar1 + uVar4;
  (__return_storage_ptr__->
  super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
  ).
  super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
  .m_rows.m_value = uVar5;
  (__return_storage_ptr__->
  super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
  ).
  super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
  .m_cols.m_value = uVar2;
  if ((long)(uVar2 | uVar5) < 0 && pdVar1 != (PointerType)0x0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                  "Eigen::MapBase<Eigen::Block<const Eigen::Ref<const Eigen::Matrix<double, -1, -1>>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Ref<const Eigen::Matrix<double, -1, -1>>>, Level = 0]"
                 );
  }
  (__return_storage_ptr__->
  super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
  ).
  super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
  .m_xpr = val;
  (__return_storage_ptr__->
  super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
  ).
  super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
  .m_startRow.m_value = uVar4;
  (__return_storage_ptr__->
  super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
  ).
  super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
  .m_startCol.m_value = 0;
  (__return_storage_ptr__->
  super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
  ).
  super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
  .m_outerStride =
       (val->
       super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).m_stride.m_outer.m_value;
  if (((-1 < (long)(uVar5 | uVar4)) && (-1 < (long)uVar2)) &&
     ((long)uVar4 <=
      (long)((val->
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_rows.m_value - uVar5))) {
    return __return_storage_ptr__;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<const Eigen::Ref<const Eigen::Matrix<double, -1, -1>>>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Ref<const Eigen::Matrix<double, -1, -1>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
               );
}

Assistant:

inline typename ConstViewReturnType<T, F>::Type Manifold::getConstView<T, F>(
    const ConstRefMat& val, size_t ir, size_t) const
{
  return val.middleRows(getStart<T>(ir), getDim<T>(ir));
}